

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

SizeType __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Append
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType l1,
          SizeType l2)

{
  State *pSVar1;
  SizeType old;
  SizeType l2_local;
  SizeType l1_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  old = l1;
  while( true ) {
    pSVar1 = GetState(this,old);
    if (pSVar1->out == 0xffffffff) break;
    pSVar1 = GetState(this,old);
    old = pSVar1->out;
  }
  pSVar1 = GetState(this,old);
  pSVar1->out = l2;
  return l1;
}

Assistant:

SizeType Append(SizeType l1, SizeType l2) {
        SizeType old = l1;
        while (GetState(l1).out != kRegexInvalidState)
            l1 = GetState(l1).out;
        GetState(l1).out = l2;
        return old;
    }